

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL5RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  DecodeStatus DVar2;
  uint local_44;
  DecodeStatus S;
  uint Op5;
  uint Op4;
  uint Op3;
  uint Op2;
  uint Op1;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  _Op2 = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar1 = fieldFromInstruction_4(Insn,0,0x10);
  DVar2 = Decode3OpInstruction(uVar1,&Op3,&Op4,&Op5);
  if (DVar2 == MCDisassembler_Success) {
    uVar1 = fieldFromInstruction_4(Address_local._4_4_,0x10,0x10);
    DVar2 = Decode2OpInstruction(uVar1,&S,&local_44);
    if (DVar2 == MCDisassembler_Success) {
      DecodeGRRegsRegisterClass(pMStack_18,Op3,(uint64_t)Decoder_local,_Op2);
      DecodeGRRegsRegisterClass(pMStack_18,S,(uint64_t)Decoder_local,_Op2);
      DecodeGRRegsRegisterClass(pMStack_18,Op4,(uint64_t)Decoder_local,_Op2);
      DecodeGRRegsRegisterClass(pMStack_18,Op5,(uint64_t)Decoder_local,_Op2);
      DecodeGRRegsRegisterClass(pMStack_18,local_44,(uint64_t)Decoder_local,_Op2);
      Inst_local._4_4_ = MCDisassembler_Success;
    }
    else {
      Inst_local._4_4_ =
           DecodeL5RInstructionFail(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Op2);
    }
  }
  else {
    Inst_local._4_4_ =
         DecodeL5RInstructionFail(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Op2);
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeL5RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3, Op4, Op5;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S != MCDisassembler_Success)
		return DecodeL5RInstructionFail(Inst, Insn, Address, Decoder);

	S = Decode2OpInstruction(fieldFromInstruction_4(Insn, 16, 16), &Op4, &Op5);
	if (S != MCDisassembler_Success)
		return DecodeL5RInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op5, Address, Decoder);
	return S;
}